

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_lib.c
# Opt level: O3

int ec_precompute_mont_data(EC_GROUP *group)

{
  int iVar1;
  BN_CTX *ctx;
  BN_MONT_CTX *mont;
  int iVar2;
  
  ctx = BN_CTX_new();
  BN_MONT_CTX_free((BN_MONT_CTX *)group->mont_data);
  group->mont_data = (BN_MONT_CTX *)0x0;
  iVar2 = 0;
  if (ctx != (BN_CTX *)0x0) {
    mont = BN_MONT_CTX_new();
    group->mont_data = (BN_MONT_CTX *)mont;
    iVar2 = 0;
    if (mont != (BN_MONT_CTX *)0x0) {
      iVar1 = BN_MONT_CTX_set(mont,(BIGNUM *)group->order,ctx);
      iVar2 = 1;
      if (iVar1 == 0) {
        BN_MONT_CTX_free((BN_MONT_CTX *)group->mont_data);
        group->mont_data = (BN_MONT_CTX *)0x0;
        iVar2 = 0;
      }
    }
  }
  BN_CTX_free(ctx);
  return iVar2;
}

Assistant:

int ec_precompute_mont_data(EC_GROUP *group)
{
    BN_CTX *ctx = BN_CTX_new();
    int ret = GML_ERROR;

    BN_MONT_CTX_free(group->mont_data);
    group->mont_data = NULL;

    if (ctx == NULL)
        goto err;

    group->mont_data = BN_MONT_CTX_new();
    if (group->mont_data == NULL)
        goto err;

    if (!BN_MONT_CTX_set(group->mont_data, group->order, ctx)) {
        BN_MONT_CTX_free(group->mont_data);
        group->mont_data = NULL;
        goto err;
    }

    ret = GML_OK;

 err:

    BN_CTX_free(ctx);
    return ret;
}